

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alprd.hpp
# Opt level: O0

void duckdb::alp::AlpRDCompression<double,_false>::Compress
               (EXACT_TYPE *input_vector,idx_t n_values,State *state)

{
  bool bVar1;
  unsigned_short uVar2;
  mapped_type *pmVar3;
  idx_t iVar4;
  idx_t iVar5;
  byte *in_RDX;
  ulong in_RSI;
  long in_RDI;
  idx_t left_bit_packed_size;
  idx_t right_bit_packed_size;
  uint16_t dictionary_key;
  uint16_t dictionary_index;
  idx_t i_1;
  EXACT_TYPE tmp;
  idx_t i;
  uint16_t left_parts [1024];
  uint64_t right_parts [1024];
  undefined7 in_stack_ffffffffffffd798;
  bitpacking_width_t in_stack_ffffffffffffd79f;
  unordered_map<unsigned_short,_unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>_>
  *in_stack_ffffffffffffd7a0;
  _Node_iterator_base<std::pair<const_unsigned_short,_unsigned_short>,_false> local_2848;
  _Node_iterator_base<std::pair<const_unsigned_short,_unsigned_short>,_false> local_2840;
  unsigned_short local_2834;
  ushort local_2832;
  ulong local_2830;
  unordered_map<unsigned_short,_unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>_>
  *local_2828;
  ulong local_2820;
  unsigned_short local_2818 [3];
  bitpacking_width_t in_stack_ffffffffffffd7ef;
  idx_t in_stack_ffffffffffffd7f0;
  unsigned_short *in_stack_ffffffffffffd7f8;
  data_ptr_t in_stack_ffffffffffffd800;
  bitpacking_width_t in_stack_ffffffffffffd8af;
  idx_t in_stack_ffffffffffffd8b0;
  unsigned_long *in_stack_ffffffffffffd8b8;
  data_ptr_t in_stack_ffffffffffffd8c0;
  ulong local_2018 [1024];
  byte *local_18;
  ulong local_10;
  long local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_2820 = 0; local_2820 < local_10; local_2820 = local_2820 + 1) {
    in_stack_ffffffffffffd7a0 =
         *(unordered_map<unsigned_short,_unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>_>
           **)(local_8 + local_2820 * 8);
    local_2018[local_2820] = (ulong)in_stack_ffffffffffffd7a0 & (1L << (*local_18 & 0x3f)) - 1U;
    local_2828 = in_stack_ffffffffffffd7a0;
    uVar2 = UnsafeNumericCast<unsigned_short,unsigned_long,void>
                      ((ulong)in_stack_ffffffffffffd7a0 >> (*local_18 & 0x3f));
    local_2818[local_2820] = uVar2;
  }
  for (local_2830 = 0; local_2830 < local_10; local_2830 = local_2830 + 1) {
    local_2834 = local_2818[local_2830];
    local_2840._M_cur =
         (__node_type *)
         ::std::
         unordered_map<unsigned_short,_unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>_>
         ::find((unordered_map<unsigned_short,_unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>_>
                 *)CONCAT17(in_stack_ffffffffffffd79f,in_stack_ffffffffffffd798),
                (key_type *)0xabb53b);
    local_2848._M_cur =
         (__node_type *)
         ::std::
         unordered_map<unsigned_short,_unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>_>
         ::end((unordered_map<unsigned_short,_unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>_>
                *)CONCAT17(in_stack_ffffffffffffd79f,in_stack_ffffffffffffd798));
    bVar1 = ::std::__detail::operator==(&local_2840,&local_2848);
    if (bVar1) {
      local_2832 = (ushort)local_18[0x5060];
    }
    else {
      pmVar3 = ::std::
               unordered_map<unsigned_short,_unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>_>
               ::operator[](in_stack_ffffffffffffd7a0,
                            (key_type *)
                            CONCAT17(in_stack_ffffffffffffd79f,in_stack_ffffffffffffd798));
      local_2832 = *pmVar3;
    }
    local_2818[local_2830] = local_2832;
    if (local_18[0x5060] <= local_2832) {
      *(unsigned_short *)(local_18 + (ulong)*(ushort *)(local_18 + 2) * 2 + 0x4014) = local_2834;
      uVar2 = UnsafeNumericCast<unsigned_short,unsigned_long,void>(local_2830);
      *(unsigned_short *)(local_18 + (ulong)*(ushort *)(local_18 + 2) * 2 + 0x4814) = uVar2;
      *(short *)(local_18 + 2) = *(short *)(local_18 + 2) + 1;
    }
  }
  iVar4 = BitpackingPrimitives::GetRequiredSize
                    ((idx_t)in_stack_ffffffffffffd7a0,in_stack_ffffffffffffd79f);
  iVar5 = BitpackingPrimitives::GetRequiredSize
                    ((idx_t)in_stack_ffffffffffffd7a0,in_stack_ffffffffffffd79f);
  BitpackingPrimitives::PackBuffer<unsigned_short,false>
            (in_stack_ffffffffffffd800,in_stack_ffffffffffffd7f8,in_stack_ffffffffffffd7f0,
             in_stack_ffffffffffffd7ef);
  BitpackingPrimitives::PackBuffer<unsigned_long,false>
            (in_stack_ffffffffffffd8c0,in_stack_ffffffffffffd8b8,in_stack_ffffffffffffd8b0,
             in_stack_ffffffffffffd8af);
  *(idx_t *)(local_18 + 0x5018) = iVar5;
  *(idx_t *)(local_18 + 0x5020) = iVar4;
  return;
}

Assistant:

static void Compress(const EXACT_TYPE *input_vector, idx_t n_values, State &state) {

		uint64_t right_parts[AlpRDConstants::ALP_VECTOR_SIZE];
		uint16_t left_parts[AlpRDConstants::ALP_VECTOR_SIZE];

		// Cutting the floating point values
		for (idx_t i = 0; i < n_values; i++) {
			EXACT_TYPE tmp = input_vector[i];
			right_parts[i] = tmp & ((1ULL << state.right_bit_width) - 1);
			left_parts[i] = UnsafeNumericCast<uint16_t>(tmp >> state.right_bit_width);
		}

		// Dictionary encoding for left parts
		for (idx_t i = 0; i < n_values; i++) {
			uint16_t dictionary_index;
			auto dictionary_key = left_parts[i];
			if (state.left_parts_dict_map.find(dictionary_key) == state.left_parts_dict_map.end()) {
				//! If not found on the dictionary we store the smallest non-key index as exception (the dict size)
				dictionary_index = state.actual_dictionary_size;
			} else {
				dictionary_index = state.left_parts_dict_map[dictionary_key];
			}
			left_parts[i] = dictionary_index;

			//! Left parts not found in the dictionary are stored as exceptions
			if (dictionary_index >= state.actual_dictionary_size) {
				state.exceptions[state.exceptions_count] = dictionary_key;
				state.exceptions_positions[state.exceptions_count] = UnsafeNumericCast<uint16_t>(i);
				state.exceptions_count++;
			}
		}

		auto right_bit_packed_size = BitpackingPrimitives::GetRequiredSize(n_values, state.right_bit_width);
		auto left_bit_packed_size = BitpackingPrimitives::GetRequiredSize(n_values, state.left_bit_width);

		if (!EMPTY) {
			// Bitpacking Left and Right parts
			BitpackingPrimitives::PackBuffer<uint16_t, false>(state.left_parts_encoded, left_parts, n_values,
			                                                  state.left_bit_width);
			BitpackingPrimitives::PackBuffer<uint64_t, false>(state.right_parts_encoded, right_parts, n_values,
			                                                  state.right_bit_width);
		}

		state.left_bit_packed_size = left_bit_packed_size;
		state.right_bit_packed_size = right_bit_packed_size;
	}